

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::ExternalCommand::configureDescription
          (ExternalCommand *this,ConfigureContext *param_1,StringRef value)

{
  StringRef local_40;
  string local_30;
  
  local_40.Length = value.Length;
  local_40.Data = value.Data;
  llvm::StringRef::str_abi_cxx11_(&local_30,&local_40);
  std::__cxx11::string::operator=((string *)&this->description,(string *)&local_30);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void ExternalCommand::configureDescription(const ConfigureContext&,
                                           StringRef value) {
  description = value;
}